

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MultiFileReader::BindOptions
          (MultiFileReader *this,MultiFileOptions *options,MultiFileList *files,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,MultiFileReaderBindData *bind_data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *l2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type sVar3;
  pointer pcVar4;
  element_type *peVar5;
  _Rb_tree_header *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  char cVar9;
  bool bVar10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  iterator iVar12;
  element_type *peVar13;
  MultiFileList *pMVar14;
  reference pvVar15;
  InternalException *pIVar16;
  BinderException *this_01;
  string *l1;
  long lVar17;
  string *psVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  MultiFileListIterator __begin2;
  string error;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  MultiFileListIterator __end2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  file_partitions;
  allocator local_319;
  undefined8 local_318;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  MultiFileOptions *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  size_type local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [2];
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *local_288;
  MultiFileReaderBindData *local_280;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  MultiFileListIterator local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_288 = (vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)return_types;
  local_280 = bind_data;
  if (options->filename == true) {
    _Var11 = ::std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       ((names->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (names->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&options->filename_column);
    pbVar1 = (names->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (_Var11._M_current != pbVar1) {
      this_01 = (BinderException *)__cxa_allocate_exception(0x10);
      local_2c8._0_8_ = auStack_2b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,
                 "Option filename adds column \"%s\", but a column with this name is also in the file. Try setting a different name: filename=\'<filename column name>\'"
                 ,"");
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar4 = (options->filename_column)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar4,pcVar4 + (options->filename_column)._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(this_01,(string *)local_2c8,&local_80);
      __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_idx::optional_idx
              ((optional_idx *)local_2c8,
               (long)pbVar1 -
               (long)(names->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    (local_280->filename_idx).index = local_2c8._0_8_;
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalTypeId_const&>(local_288,&LogicalType::VARCHAR);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
               &options->filename_column);
  }
  if (options->hive_partitioning == true) {
    (*files->_vptr_MultiFileList[8])((string *)local_2c8,files,0);
    HivePartitioning::Parse
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_1b0,(string *)local_2c8);
    if ((pointer)auStack_2b8._24_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2b8._24_8_);
    }
    if ((MultiFileList *)local_2c8._0_8_ != (MultiFileList *)auStack_2b8) {
      operator_delete((void *)local_2c8._0_8_);
    }
    MultiFileListIterationHelper::MultiFileListIterationHelper
              ((MultiFileListIterationHelper *)local_2c8,files);
    pMVar14 = (MultiFileList *)local_2c8._0_8_;
    cVar9 = (**(code **)(*(long *)local_2c8._0_8_ + 0x28))(local_2c8._0_8_);
    if (cVar9 == '\0') {
      pMVar14 = (MultiFileList *)0x0;
    }
    MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
              ((MultiFileListIterator *)local_2c8,pMVar14);
    local_318 = (element_type *)files;
    local_300 = options;
    MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
              (&local_100,(MultiFileList *)0x0);
    p_Var6 = &local_1b0._M_impl.super__Rb_tree_header;
    local_278 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
    while (((MultiFileList *)local_2c8._0_8_ != local_100.file_list.ptr ||
           (local_2c8._8_8_ != local_100.file_scan_data.current_file_idx))) {
      HivePartitioning::Parse
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60,(string *)auStack_2b8);
      for (peVar13 = (element_type *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
          peVar13 != (element_type *)p_Var6;
          peVar13 = (element_type *)::std::_Rb_tree_increment((_Rb_tree_node_base *)peVar13)) {
        iVar12 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&local_60,(key_type *)&(peVar13->alias).field_2);
        if ((_Rb_tree_header *)iVar12._M_node == &local_60._M_impl.super__Rb_tree_header) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,
                     "Hive partition mismatch between file \"%s\" and \"%s\": key \"%s\" not found",
                     "");
          bVar10 = local_300->auto_detect_hive_partitioning;
          pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
          if (bVar10 == true) {
            ::std::operator+(&local_270,&local_250,"(hive partitioning was autodetected)");
            (*local_318->_vptr_ExtraTypeInfo[8])(&local_2f8,local_318,0);
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            if (local_2f8 == local_2e8) {
              local_1d0.field_2._8_4_ = local_2e8[0]._8_4_;
              local_1d0.field_2._12_4_ = local_2e8[0]._12_4_;
            }
            else {
              local_1d0._M_dataplus._M_p = (pointer)local_2f8;
            }
            local_1d0._M_string_length = local_2f0;
            local_2f0 = 0;
            local_2e8[0]._M_allocated_capacity._0_4_ =
                 (undefined4)local_2e8[0]._M_allocated_capacity & 0xffffff00;
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            local_2f8 = local_2e8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,auStack_2b8._0_8_,auStack_2b8._8_8_ + auStack_2b8._0_8_)
            ;
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            sVar3 = (peVar13->alias).field_2._M_allocated_capacity;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,sVar3,
                       *(long *)((long)&(peVar13->alias).field_2 + 8) + sVar3);
            InternalException::
            InternalException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (pIVar16,&local_270,&local_1d0,&local_120,&local_140);
            __cxa_throw(pIVar16,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          ::std::__cxx11::string::string((string *)&local_270,local_250._M_dataplus._M_p,&local_319)
          ;
          (*local_318->_vptr_ExtraTypeInfo[8])(&local_2f8,local_318,0);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          if (local_2f8 == local_2e8) {
            local_1f0.field_2._8_4_ = local_2e8[0]._8_4_;
            local_1f0.field_2._12_4_ = local_2e8[0]._12_4_;
          }
          else {
            local_1f0._M_dataplus._M_p = (pointer)local_2f8;
          }
          local_1f0._M_string_length = local_2f0;
          local_2f0 = 0;
          local_2e8[0]._M_allocated_capacity._0_4_ =
               (undefined4)local_2e8[0]._M_allocated_capacity & 0xffffff00;
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          local_2f8 = local_2e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,auStack_2b8._0_8_,auStack_2b8._8_8_ + auStack_2b8._0_8_);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          sVar3 = (peVar13->alias).field_2._M_allocated_capacity;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,sVar3,
                     *(long *)((long)&(peVar13->alias).field_2 + 8) + sVar3);
          BinderException::
          BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((BinderException *)pIVar16,&local_270,&local_1f0,&local_160,&local_180);
          __cxa_throw(pIVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if (local_1b0._M_impl.super__Rb_tree_header._M_node_count !=
          local_60._M_impl.super__Rb_tree_header._M_node_count) {
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"Hive partition mismatch between file \"%s\" and \"%s\"","")
        ;
        bVar10 = local_300->auto_detect_hive_partitioning;
        pIVar16 = (InternalException *)__cxa_allocate_exception(0x10);
        if (bVar10 == true) {
          ::std::operator+(&local_270,&local_250,"(hive partitioning was autodetected)");
          (*local_318->_vptr_ExtraTypeInfo[8])(&local_2f8,local_318,0);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          if (local_2f8 == local_2e8) {
            local_210.field_2._8_4_ = local_2e8[0]._8_4_;
            local_210.field_2._12_4_ = local_2e8[0]._12_4_;
          }
          else {
            local_210._M_dataplus._M_p = (pointer)local_2f8;
          }
          local_210._M_string_length = local_2f0;
          local_2f0 = 0;
          local_2e8[0]._M_allocated_capacity._0_4_ =
               (undefined4)local_2e8[0]._M_allocated_capacity & 0xffffff00;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          local_2f8 = local_2e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,auStack_2b8._0_8_,auStack_2b8._8_8_ + auStack_2b8._0_8_);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar16,&local_270,&local_210,&local_a0);
          __cxa_throw(pIVar16,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::string((string *)&local_270,local_250._M_dataplus._M_p,&local_319);
        (*local_318->_vptr_ExtraTypeInfo[8])(&local_2f8,local_318,0);
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        if (local_2f8 == local_2e8) {
          local_230.field_2._8_4_ = local_2e8[0]._8_4_;
          local_230.field_2._12_4_ = local_2e8[0]._12_4_;
        }
        else {
          local_230._M_dataplus._M_p = (pointer)local_2f8;
        }
        local_230._M_string_length = local_2f0;
        local_2f0 = 0;
        local_2e8[0]._M_allocated_capacity._0_4_ =
             (undefined4)local_2e8[0]._M_allocated_capacity & 0xffffff00;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        local_2f8 = local_2e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,auStack_2b8._0_8_,auStack_2b8._8_8_ + auStack_2b8._0_8_);
        BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                  ((BinderException *)pIVar16,&local_270,&local_230,&local_c0);
        __cxa_throw(pIVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_60);
      MultiFileListIterationHelper::MultiFileListIterator::Next((MultiFileListIterator *)local_2c8);
    }
    if (local_100.current_file.extended_info.internal.
        super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_100.current_file.extended_info.internal.
                 super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.current_file.path._M_dataplus._M_p != &local_100.current_file.path.field_2) {
      operator_delete(local_100.current_file.path._M_dataplus._M_p);
    }
    if (local_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_290._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_2b8._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_2b8 + 0x10)) {
      operator_delete((void *)auStack_2b8._0_8_);
    }
    if ((local_300->hive_types_schema)._M_h._M_element_count != 0) {
      MultiFileOptions::VerifyHiveTypesArePartitions
                (local_300,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1b0);
    }
    if ((_Rb_tree_header *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var6) {
      local_280 = (MultiFileReaderBindData *)&local_280->hive_partitioning_indexes;
      do {
        l2 = &(((element_type *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left)->alias).
              field_2;
        l1 = *(string **)local_278;
        psVar2 = *(string **)(local_278 + 8);
        lVar17 = (long)psVar2 - (long)l1 >> 7;
        local_318 = (element_type *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left;
        if (0 < lVar17) {
          lVar17 = lVar17 + 1;
          do {
            bVar10 = StringUtil::CIEquals(l1,(string *)l2);
            peVar13 = local_318;
            psVar18 = l1;
            if (bVar10) goto LAB_015b4c76;
            bVar10 = StringUtil::CIEquals(l1 + 1,(string *)l2);
            peVar13 = local_318;
            psVar18 = l1 + 1;
            if (bVar10) goto LAB_015b4c76;
            bVar10 = StringUtil::CIEquals(l1 + 2,(string *)l2);
            peVar13 = local_318;
            psVar18 = l1 + 2;
            if (bVar10) goto LAB_015b4c76;
            bVar10 = StringUtil::CIEquals(l1 + 3,(string *)l2);
            peVar13 = local_318;
            psVar18 = l1 + 3;
            if (bVar10) goto LAB_015b4c76;
            l1 = l1 + 4;
            lVar17 = lVar17 + -1;
          } while (1 < lVar17);
        }
        peVar13 = local_318;
        lVar17 = (long)psVar2 - (long)l1 >> 5;
        if (lVar17 == 1) {
LAB_015b4c62:
          bVar10 = StringUtil::CIEquals(l1,(string *)l2);
          psVar18 = psVar2;
          if (bVar10) {
            psVar18 = l1;
          }
        }
        else if (lVar17 == 2) {
LAB_015b4c40:
          bVar10 = StringUtil::CIEquals(l1,(string *)l2);
          psVar18 = l1;
          if (!bVar10) {
            l1 = l1 + 1;
            goto LAB_015b4c62;
          }
        }
        else {
          psVar18 = psVar2;
          if ((lVar17 == 3) &&
             (bVar10 = StringUtil::CIEquals(l1,(string *)l2), psVar18 = l1, !bVar10)) {
            l1 = l1 + 1;
            goto LAB_015b4c40;
          }
        }
LAB_015b4c76:
        if (psVar18 == *(string **)(local_278 + 8)) {
          local_100.file_list.ptr =
               (MultiFileList *)((long)*(string **)(local_278 + 8) - *(long *)local_278 >> 5);
          MultiFileOptions::GetHiveLogicalType((LogicalType *)local_2c8,local_300,(string *)l2);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
          emplace_back<duckdb::LogicalType>
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_288,
                     (LogicalType *)local_2c8);
          LogicalType::~LogicalType((LogicalType *)local_2c8);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    (local_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l2);
        }
        else {
          pMVar14 = (MultiFileList *)
                    NumericCastImpl<unsigned_long,_long,_false>::Convert
                              ((long)psVar18 - *(long *)local_278 >> 5);
          local_100.file_list.ptr = pMVar14;
          MultiFileOptions::GetHiveLogicalType((LogicalType *)local_2c8,local_300,(string *)l2);
          pvVar15 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)local_288,(size_type)pMVar14);
          uVar8 = auStack_2b8._0_8_;
          uVar7 = local_2c8._8_8_;
          pvVar15->id_ = (LogicalTypeId)local_2c8[0];
          pvVar15->physical_type_ = local_2c8[1];
          uVar19 = *(undefined4 *)
                    &(pvVar15->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar20 = *(undefined4 *)
                    ((long)&(pvVar15->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4);
          peVar5 = (pvVar15->type_info_).internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar21 = *(undefined4 *)
                    &(pvVar15->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
          uVar22 = *(undefined4 *)
                    ((long)&(pvVar15->type_info_).internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 4);
          (pvVar15->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pvVar15->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2c8._8_8_ = 0;
          auStack_2b8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pvVar15->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pvVar15->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar7;
          (pvVar15->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_318 = peVar5;
            uStack_310 = uVar21;
            uStack_30c = uVar22;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            uVar19 = (undefined4)local_318;
            uVar20 = local_318._4_4_;
            uVar21 = uStack_310;
            uVar22 = uStack_30c;
          }
          uVar7 = auStack_2b8._0_8_;
          local_2c8._12_4_ = uVar20;
          local_2c8._8_4_ = uVar19;
          auStack_2b8._4_4_ = uVar22;
          auStack_2b8._0_4_ = uVar21;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
          }
          LogicalType::~LogicalType((LogicalType *)local_2c8);
        }
        ::std::vector<duckdb::HivePartitioningIndex,std::allocator<duckdb::HivePartitioningIndex>>::
        emplace_back<std::__cxx11::string_const&,unsigned_long&>
                  ((vector<duckdb::HivePartitioningIndex,std::allocator<duckdb::HivePartitioningIndex>>
                    *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l2,
                   (unsigned_long *)&local_100);
        local_1b0._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)peVar13);
      } while ((_Rb_tree_header *)local_1b0._M_impl.super__Rb_tree_header._M_header._M_left !=
               p_Var6);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1b0);
  }
  return;
}

Assistant:

void MultiFileReader::BindOptions(MultiFileOptions &options, MultiFileList &files, vector<LogicalType> &return_types,
                                  vector<string> &names, MultiFileReaderBindData &bind_data) {
	// Add generated constant column for filename
	if (options.filename) {
		if (std::find(names.begin(), names.end(), options.filename_column) != names.end()) {
			throw BinderException("Option filename adds column \"%s\", but a column with this name is also in the "
			                      "file. Try setting a different name: filename='<filename column name>'",
			                      options.filename_column);
		}
		bind_data.filename_idx = names.size();
		return_types.emplace_back(LogicalType::VARCHAR);
		names.emplace_back(options.filename_column);
	}

	// Add generated constant columns from hive partitioning scheme
	if (options.hive_partitioning) {
		D_ASSERT(files.GetExpandResult() != FileExpandResult::NO_FILES);
		auto partitions = HivePartitioning::Parse(files.GetFirstFile().path);
		// verify that all files have the same hive partitioning scheme
		for (const auto &file : files.Files()) {
			auto file_partitions = HivePartitioning::Parse(file.path);
			for (auto &part_info : partitions) {
				if (file_partitions.find(part_info.first) == file_partitions.end()) {
					string error = "Hive partition mismatch between file \"%s\" and \"%s\": key \"%s\" not found";
					if (options.auto_detect_hive_partitioning == true) {
						throw InternalException(error + "(hive partitioning was autodetected)",
						                        files.GetFirstFile().path, file.path, part_info.first);
					}
					throw BinderException(error.c_str(), files.GetFirstFile().path, file.path, part_info.first);
				}
			}
			if (partitions.size() != file_partitions.size()) {
				string error_msg = "Hive partition mismatch between file \"%s\" and \"%s\"";
				if (options.auto_detect_hive_partitioning == true) {
					throw InternalException(error_msg + "(hive partitioning was autodetected)",
					                        files.GetFirstFile().path, file.path);
				}
				throw BinderException(error_msg.c_str(), files.GetFirstFile().path, file.path);
			}
		}

		if (!options.hive_types_schema.empty()) {
			// verify that all hive_types are existing partitions
			options.VerifyHiveTypesArePartitions(partitions);
		}

		for (auto &part : partitions) {
			idx_t hive_partitioning_index;
			auto lookup = std::find_if(names.begin(), names.end(), [&](const string &col_name) {
				return StringUtil::CIEquals(col_name, part.first);
			});
			if (lookup != names.end()) {
				// hive partitioning column also exists in file - override
				auto idx = NumericCast<idx_t>(lookup - names.begin());
				hive_partitioning_index = idx;
				return_types[idx] = options.GetHiveLogicalType(part.first);
			} else {
				// hive partitioning column does not exist in file - add a new column containing the key
				hive_partitioning_index = names.size();
				return_types.emplace_back(options.GetHiveLogicalType(part.first));
				names.emplace_back(part.first);
			}
			bind_data.hive_partitioning_indexes.emplace_back(part.first, hive_partitioning_index);
		}
	}
}